

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_inituserpin(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  ProcErrorProc *pPVar1;
  Tcl_Interp *pTVar2;
  int iVar3;
  Tcl_Obj *pTVar4;
  Tcl_HashEntry *pTVar5;
  char *pcVar6;
  CK_RV errorCode;
  undefined1 auVar7 [16];
  CK_RV chk1_rv;
  CK_RV chk_rv;
  CK_SLOT_ID slotid;
  int tcl_rv;
  int userpin_len;
  char *userpin;
  char *pcStack_78;
  int sopin_len;
  char *sopin;
  long slotid_long;
  Tcl_Obj *tcl_userpin;
  Tcl_Obj *tcl_sopin;
  Tcl_Obj *tcl_slotid;
  Tcl_Obj *tcl_handle;
  Tcl_HashEntry *tcl_handle_entry;
  tclpkcs11_handle *handle;
  tclpkcs11_interpdata *interpdata;
  Tcl_Obj **objv_local;
  Tcl_Interp *pTStack_20;
  int objc_local;
  Tcl_Interp *interp_local;
  ClientData cd_local;
  
  interpdata = (tclpkcs11_interpdata *)objv;
  objv_local._4_4_ = objc;
  pTStack_20 = interp;
  interp_local = (Tcl_Interp *)cd;
  if (cd == (ClientData)0x0) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid clientdata",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar4);
    cd_local._4_4_ = 1;
  }
  else if (objc == 5) {
    tcl_slotid = objv[1];
    tcl_sopin = objv[2];
    tcl_userpin = objv[3];
    slotid_long = (long)objv[4];
    handle = (tclpkcs11_handle *)cd;
    tcl_handle = (Tcl_Obj *)(**(code **)((long)cd + 0x40))(cd,tcl_slotid);
    pTVar2 = pTStack_20;
    if (tcl_handle == (Tcl_Obj *)0x0) {
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
      (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
      cd_local._4_4_ = 1;
    }
    else {
      tcl_handle_entry = (Tcl_HashEntry *)tcl_handle->typePtr;
      if ((Tcl_ObjType *)tcl_handle_entry == (Tcl_ObjType *)0x0) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar4 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
        cd_local._4_4_ = 1;
      }
      else {
        slotid._0_4_ = (*tclStubsPtr->tcl_GetLongFromObj)
                                 ((Tcl_Interp_conflict *)pTStack_20,tcl_sopin,(long *)&sopin);
        cd_local._4_4_ = (int)slotid;
        if ((int)slotid == 0) {
          iVar3 = tclpkcs11_start_session((tclpkcs11_handle *)tcl_handle_entry,(CK_SLOT_ID)sopin);
          pTVar2 = pTStack_20;
          if ((long)iVar3 == 0) {
            pcStack_78 = (*tclStubsPtr->tcl_GetStringFromObj)
                                   (tcl_userpin,(int *)((long)&userpin + 4));
            pTVar5 = (*tcl_handle_entry->tablePtr[1].findProc)
                               ((Tcl_HashTable *)(tcl_handle_entry->key).objPtr,(char *)0x0);
            pTVar2 = pTStack_20;
            if (pTVar5 == (Tcl_HashEntry *)0x0) {
              pcVar6 = (*tclStubsPtr->tcl_GetStringFromObj)
                                 ((Tcl_Obj *)slotid_long,(int *)((long)&slotid + 4));
              _tcl_rv = pcVar6;
              auVar7 = (*(code *)tcl_handle_entry->tablePtr[1].buckets)
                                 ((tcl_handle_entry->key).oneWordValue,pcVar6,(long)slotid._4_4_);
              errorCode = auVar7._0_8_;
              pTVar5 = (*tcl_handle_entry->tablePtr[1].createProc)
                                 ((Tcl_HashTable *)(tcl_handle_entry->key).objPtr,pcVar6,
                                  auVar7._8_8_);
              pTVar2 = pTStack_20;
              if (pTVar5 != (Tcl_HashEntry *)0x0) {
                if (pTVar5 != (Tcl_HashEntry *)0x32) {
                  pPVar1 = tclStubsPtr->tcl_SetObjResult;
                  pTVar4 = tclpkcs11_pkcs11_error((CK_RV)pTVar5);
                  (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
                  return 1;
                }
                *(undefined4 *)&tcl_handle_entry->hash = 0;
                (*(code *)tcl_handle_entry->tablePtr[1].staticBuckets[2])();
              }
              pTVar2 = pTStack_20;
              if (errorCode == 0) {
                pPVar1 = tclStubsPtr->tcl_SetObjResult;
                pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(1);
                (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
                cd_local._4_4_ = 0;
              }
              else if (errorCode == 0xa0) {
                pPVar1 = tclStubsPtr->tcl_SetObjResult;
                pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(0);
                (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
                cd_local._4_4_ = 0;
              }
              else {
                pPVar1 = tclStubsPtr->tcl_SetObjResult;
                pTVar4 = tclpkcs11_pkcs11_error(errorCode);
                (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
                cd_local._4_4_ = 1;
              }
            }
            else if (pTVar5 == (Tcl_HashEntry *)0xa0) {
              pPVar1 = tclStubsPtr->tcl_SetObjResult;
              pTVar4 = (*tclStubsPtr->tcl_NewIntObj)(0);
              (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
              cd_local._4_4_ = 0;
            }
            else {
              pPVar1 = tclStubsPtr->tcl_SetObjResult;
              pTVar4 = tclpkcs11_pkcs11_error((CK_RV)pTVar5);
              (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
              cd_local._4_4_ = 1;
            }
          }
          else {
            pPVar1 = tclStubsPtr->tcl_SetObjResult;
            pTVar4 = tclpkcs11_pkcs11_error((long)iVar3);
            (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar4);
            cd_local._4_4_ = 1;
          }
        }
      }
    }
  }
  else {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar4 = (*tclStubsPtr->tcl_NewStringObj)
                       ("wrong # args: should be \"pki::pkcs11::inituserpin handle slot sopin userpin\""
                        ,-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar4);
    cd_local._4_4_ = 1;
  }
  return cd_local._4_4_;
}

Assistant:

MODULE_SCOPE int tclpkcs11_inituserpin(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid, *tcl_sopin, *tcl_userpin;
  long slotid_long;
  char *sopin;
  int sopin_len;
  char *userpin;
  int userpin_len;
  int tcl_rv;

  CK_SLOT_ID slotid;
  CK_RV chk_rv;
  CK_RV chk1_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 5) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::inituserpin handle slot sopin userpin\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];
  tcl_sopin = objv[3];
  tcl_userpin = objv[4];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));
    return(TCL_ERROR);
  }

  sopin = Tcl_GetStringFromObj(tcl_sopin, &sopin_len);
  chk_rv = handle->pkcs11->C_Login(handle->session, CKU_SO, (CK_UTF8CHAR_PTR) sopin, sopin_len);
  if (chk_rv != CKR_OK) {
      if (chk_rv == CKR_PIN_INCORRECT) {
          Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));
          return(TCL_OK);
      }
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));
      return(TCL_ERROR);
  }
  userpin = Tcl_GetStringFromObj(tcl_userpin, &userpin_len);
  chk1_rv = handle->pkcs11->C_InitPIN(handle->session, (CK_UTF8CHAR_PTR) userpin, userpin_len);
  chk_rv = handle->pkcs11->C_Logout(handle->session);
  if (chk_rv != CKR_OK) {
    if (chk_rv == CKR_DEVICE_REMOVED) {
      handle->session_active = 0;

      handle->pkcs11->C_CloseSession(handle->session);
    } else {
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      return(TCL_ERROR);
    }
  }
  if (chk1_rv != CKR_OK) {
      if (chk1_rv == CKR_PIN_INCORRECT) {
          Tcl_SetObjResult(interp, Tcl_NewBooleanObj(0));
          return(TCL_OK);
      }
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk1_rv));
      return(TCL_ERROR);
  }

  Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));
  return(TCL_OK);
}